

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reliveapp.cpp
# Opt level: O0

void __thiscall relive::ReLiveApp::ReLiveApp(ReLiveApp *this)

{
  GLFWmonitor *handle;
  GLFWvidmode *pGVar1;
  uri *in_stack_00000370;
  function<void_(int)> *in_stack_00000378;
  ReLiveDB *in_stack_00000380;
  GLFWvidmode *mode;
  string local_188;
  uri local_168;
  anon_class_8_1_8991fb9c local_98;
  function<void_(int)> local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  ReLiveApp *local_10;
  ReLiveApp *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,anon_var_dwarf_3391e,&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"reLiveG",&local_69);
  ImGui::Application::Application(&this->super_Application,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__ReLiveApp_0056ebf0;
  this->FONT_SIZE = 16.0;
  this->HEADER_FONT_SIZE = 18.0;
  this->TOP_PANEL_HEIGHT = 64.0;
  this->BOTTOM_PANEL_HEIGHT = 100.0;
  this->PANEL_SHADOW = 24.0;
  this->PLAY_BAR_HEIGHT = 24.0;
  this->PLAY_CONTROLS_WIDTH = 150.0;
  this->PLAY_BAR_REL_END = this->PLAY_CONTROLS_WIDTH + 24.0;
  this->_width = 0.0;
  this->_height = 0.0;
  this->_show_demo_window = true;
  this->_lateSetup = true;
  std::mutex::mutex(&this->_mutex);
  local_98.this = this;
  std::function<void(int)>::function<relive::ReLiveApp::ReLiveApp()::__0,void>
            ((function<void(int)> *)&local_90,&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"https://api.relive.nu",(allocator<char> *)((long)&mode + 7));
  ghc::net::uri::uri(&local_168,&local_188);
  ReLiveDB::ReLiveDB(in_stack_00000380,in_stack_00000378,in_stack_00000370);
  ghc::net::uri::~uri(&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mode + 7));
  std::function<void_(int)>::~function(&local_90);
  this->_lastFetch = 0;
  this->_lastSavepoint = 0;
  this->_lastPlayPos = 0;
  this->_wheelAction = 0;
  Player::Player(&this->_player);
  StyleManager::StyleManager(&this->_style);
  this->_propFont = (ImFont *)0x0;
  this->_headerFont = (ImFont *)0x0;
  this->_monoFont = (ImFont *)0x0;
  std::atomic<bool>::atomic(&this->_needsRefresh,true);
  this->_currentPage = pSTATIONS;
  std::vector<relive::Station,_std::allocator<relive::Station>_>::vector(&this->_stations);
  this->_activeStation = 0;
  std::vector<relive::Stream,_std::allocator<relive::Stream>_>::vector(&this->_streams);
  Stream::Stream(&this->_liveStream);
  this->_activeStream = 0;
  std::vector<relive::Track,_std::allocator<relive::Track>_>::vector(&this->_tracks);
  this->_activeTrack = 0;
  Track::Track(&this->_activeTrackInfo);
  std::vector<relive::ChatMessage,_std::allocator<relive::ChatMessage>_>::vector(&this->_chat);
  std::vector<ImVec2,_std::allocator<ImVec2>_>::vector(&this->_messageSizes);
  this->_maxNickSize = 0.0;
  this->_chatLogHeight = 0.0;
  this->_chatMessageWidth = 0.0;
  this->_chatPosition = -1;
  this->_forceScroll = false;
  this->_progress = 0;
  std::__cxx11::string::string((string *)&this->_searchText);
  this->_darkMode = true;
  this->_receiveBufferBar = false;
  this->_startAtLastPosition = true;
  this->_nameColorSeed = 0x7a69;
  Player::Device::Device(&this->_outputDevice);
  handle = glfwGetPrimaryMonitor();
  pGVar1 = glfwGetVideoMode(handle);
  ImGui::Application::setWindowSize
            (&this->super_Application,(uint)(long)((double)pGVar1->width * 0.5),
             (uint)(long)((double)pGVar1->height * 0.5));
  return;
}

Assistant:

ReLiveApp::ReLiveApp()
    : ImGui::Application(RELIVE_APP_NAME " " RELIVE_VERSION_STRING_LONG " - \u00a9 2020 by Gulrak", "reLiveG")
    , _rdb([&](int percent) { progress(percent); })
    , _lastFetch(0)
    , _activeStation(0)
    , _activeStream(0)
    , _activeTrack(0)
{
    const GLFWvidmode* mode = glfwGetVideoMode(glfwGetPrimaryMonitor());
    setWindowSize(static_cast<unsigned>(mode->width * 0.5), static_cast<unsigned>(mode->height * 0.5));
    // LogManager::instance()->defaultLevel(1);
}